

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.h
# Opt level: O3

void __thiscall BezierCurve::BezierCurve(BezierCurve *this)

{
  posFlagsTy *ppVar1;
  
  (this->start)._lat = NAN;
  (this->start)._lon = NAN;
  (this->start)._alt = NAN;
  (this->start)._ts = NAN;
  (this->start)._head = NAN;
  (this->start)._pitch = NAN;
  (this->start)._roll = NAN;
  (this->start).mergeCount = 1;
  ppVar1 = &(this->start).f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->start).edgeIdx = 0xffffffffffffffff;
  (this->end)._lat = NAN;
  (this->end)._lon = NAN;
  (this->end)._alt = NAN;
  (this->end)._ts = NAN;
  (this->end)._head = NAN;
  (this->end)._pitch = NAN;
  (this->end)._roll = NAN;
  (this->end).mergeCount = 1;
  ppVar1 = &(this->end).f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->end).edgeIdx = 0xffffffffffffffff;
  (this->ptCtrl).x = NAN;
  (this->ptCtrl).y = NAN;
  return;
}

Assistant:

positionTy () : _lat(NAN), _lon(NAN), _alt(NAN), _ts(NAN), _head(NAN), _pitch(NAN), _roll(NAN),
    f{FPH_UNKNOWN,false,GND_UNKNOWN,UNIT_WORLD,UNIT_DEG,SPOS_NONE,false}
    {}